

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCDecoder.cpp
# Opt level: O2

void ZXing::MaxiCode::DecodedBitStreamParser::GetMessage
               (ByteArray *bytes,int start,int len,Content *result,StructuredAppendInfo *sai)

{
  byte bVar1;
  pointer puVar2;
  int iVar3;
  uint uVar4;
  ECI EVar5;
  ushort *puVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  ECI EVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  bool bVar15;
  int local_74;
  string local_50;
  long lVar10;
  
  iVar13 = -1;
  local_74 = 0;
  iVar14 = 0;
  iVar12 = start;
  do {
    if (len + start <= iVar12) {
      return;
    }
    puVar6 = (ushort *)
             std::array<short,_64UL>::at
                       ((array<short,_64UL> *)(CHARSETS + (long)iVar14 * 0x80),
                        (ulong)(bytes->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start[iVar12]);
    iVar3 = *puVar6 - 0x100;
    switch(iVar3) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 4:
      iVar13 = 0;
      local_74 = iVar14;
      break;
    case 5:
      iVar13 = 1;
      local_74 = iVar14;
      goto LAB_0016d704;
    case 6:
      iVar13 = 2;
      local_74 = iVar14;
      goto LAB_0016d704;
    case 7:
      iVar13 = -2;
LAB_0016d704:
      iVar3 = 0;
      break;
    case 8:
      iVar13 = -2;
      iVar3 = 1;
      break;
    case 9:
switchD_0016d633_caseD_9:
      iVar13 = -2;
      iVar3 = iVar14;
      break;
    case 10:
      puVar2 = (bytes->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      bVar1 = puVar2[(long)iVar12 + 1];
      EVar11 = (ECI)bVar1;
      if ((bVar1 & 0x20) == 0) {
        iVar12 = iVar12 + 1;
      }
      else {
        EVar5 = (ECI)puVar2[(long)iVar12 + 2];
        uVar8 = (uint)bVar1;
        if ((bVar1 & 0x10) == 0) {
          iVar3 = 2;
          EVar11 = (uVar8 & 0xf) << 6;
        }
        else {
          lVar9 = (long)iVar12;
          if ((bVar1 & 8) != 0) {
            lVar10 = (long)iVar12;
            iVar12 = iVar12 + 4;
            EVar11 = (uint)puVar2[lVar9 + 3] << 6 | EVar5 << 0xc | (uVar8 & 3) << 0x12 |
                     (uint)puVar2[lVar10 + 4];
            goto LAB_0016d76a;
          }
          iVar3 = 3;
          EVar11 = (uVar8 & 7) << 0xc;
          EVar5 = EVar5 << 6 | (uint)puVar2[lVar9 + 3];
        }
        iVar12 = iVar12 + iVar3;
        EVar11 = EVar11 | EVar5;
      }
LAB_0016d76a:
      Content::switchEncoding(result,EVar11);
      goto LAB_0016d774;
    case 0xb:
      puVar2 = (bytes->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      ToString<int,void>(&local_50,
                         (ZXing *)(ulong)((uint)puVar2[(long)iVar12 + 5] +
                                         (uint)puVar2[(long)iVar12 + 4] * 0x40 +
                                         (uint)puVar2[(long)iVar12 + 3] * 0x1000 +
                                         (uint)puVar2[(long)iVar12 + 2] * 0x40000 +
                                         (uint)puVar2[(long)iVar12 + 1] * 0x1000000),9,
                         (uint)puVar2[(long)iVar12 + 3] * 0x1000);
      Content::append(result,&local_50);
      iVar12 = iVar12 + 5;
      std::__cxx11::string::~string((string *)&local_50);
      goto LAB_0016d774;
    case 0xc:
      if (iVar12 != start) goto switchD_0016d633_caseD_9;
      bVar1 = (bytes->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[(long)start + 1];
      uVar7 = bVar1 >> 3 & 7;
      uVar4 = bVar1 & 7;
      uVar8 = uVar4 + 1;
      if (uVar4 < uVar7) {
        uVar8 = 0;
      }
      sai->index = uVar7;
      if ((bVar1 & 7) == 0) {
        uVar8 = uVar4;
      }
      sai->count = uVar8;
      iVar13 = -2;
      iVar12 = (int)((long)start + 1);
      iVar3 = iVar14;
      break;
    default:
      Content::push_back(result,(uint8_t)*puVar6);
LAB_0016d774:
      bVar15 = iVar13 == 0;
      iVar13 = iVar13 + -1;
      iVar3 = iVar14;
      if (bVar15) {
        iVar3 = local_74;
      }
    }
    iVar14 = iVar3;
    iVar12 = iVar12 + 1;
  } while( true );
}

Assistant:

static void GetMessage(const ByteArray& bytes, int start, int len, Content& result, StructuredAppendInfo& sai)
{
	int shift = -1;
	int set = 0;
	int lastset = 0;

	for (int i = start; i < start + len; i++) {
		int c = CHARSETS[set].at(bytes[i]);
		switch (c) {
		case LCHA:
			set   = 0;
			shift = -1;
			break;
		case LCHB:
			set   = 1;
			shift = -1;
			break;
		case SHI0:
		case SHI1:
		case SHI2:
		case SHI3:
		case SHI4:
			lastset = set;
			set     = c - SHI0;
			shift   = 1;
			break;
		case TWSA:
			lastset = set;
			set     = 0;
			shift   = 2;
			break;
		case TRSA:
			lastset = set;
			set     = 0;
			shift   = 3;
			break;
		case NS:
			result.append(
				ToString((bytes[i + 1] << 24) + (bytes[i + 2] << 18) + (bytes[i + 3] << 12) + (bytes[i + 4] << 6) + bytes[i + 5], 9));
			i += 5;
			break;
		case LOCK: shift = -1; break;
		case ECI: result.switchEncoding(ParseECIValue(bytes, i)); break;
		case PAD:
			if (i == start)
				ParseStructuredAppend(bytes, i, sai);
			shift = -1;
			break;
		default: result.push_back(c);
		}

		if (shift-- == 0)
			set = lastset;
	}
}